

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O1

result_type __thiscall
boost::function1<void,_const_boost::debug::dbg_startup_info_&>::operator()
          (function1<void,_const_boost::debug::dbg_startup_info_&> *this,dbg_startup_info *a0)

{
  vtable_base *pvVar1;
  bad_function_call local_18;
  
  pvVar1 = (this->super_function_base).vtable;
  if (pvVar1 != (vtable_base *)0x0) {
    (**(code **)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8))(&(this->super_function_base).functor);
    return;
  }
  std::runtime_error::runtime_error(&local_18.super_runtime_error,"call to empty boost::function");
  local_18._0_8_ = &PTR__runtime_error_001cd118;
  throw_exception<boost::bad_function_call>(&local_18);
}

Assistant:

bool
        assign_to(FunctionObj f, function_buffer& functor, function_obj_tag) const
        {
          if (!boost::detail::function::has_empty_target(boost::addressof(f))) {
            assign_functor(f, functor,
                           mpl::bool_<(function_allows_small_object_optimization<FunctionObj>::value)>());
            return true;
          } else {
            return false;
          }
        }